

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<long,double>::insert<google::protobuf::Map<long,double>::const_iterator>
          (Map<long,double> *this,const_iterator first,const_iterator last)

{
  double dVar1;
  bool bVar2;
  const_pointer pvVar3;
  double *pdVar4;
  iterator local_58;
  undefined1 local_40 [8];
  iterator exist_it;
  const_iterator it;
  Map<long,_double> *this_local;
  
  exist_it.it_.bucket_index_ = (size_type)first.it_.node_;
  while (bVar2 = protobuf::operator!=((const_iterator *)&exist_it.it_.bucket_index_,&last), bVar2) {
    pvVar3 = Map<long,_double>::const_iterator::operator->
                       ((const_iterator *)&exist_it.it_.bucket_index_);
    Map<long,_double>::find((iterator *)local_40,(Map<long,_double> *)this,&pvVar3->first);
    Map<long,_double>::end(&local_58,(Map<long,_double> *)this);
    bVar2 = protobuf::operator==((iterator *)local_40,&local_58);
    if (bVar2) {
      pvVar3 = Map<long,_double>::const_iterator::operator->
                         ((const_iterator *)&exist_it.it_.bucket_index_);
      dVar1 = pvVar3->second;
      pvVar3 = Map<long,_double>::const_iterator::operator->
                         ((const_iterator *)&exist_it.it_.bucket_index_);
      pdVar4 = Map<long,_double>::operator[]((Map<long,_double> *)this,&pvVar3->first);
      *pdVar4 = dVar1;
    }
    Map<long,_double>::const_iterator::operator++((const_iterator *)&exist_it.it_.bucket_index_);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }